

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::AddCTestConfigurationOverwrite(cmCTest *this,string *overStr)

{
  long lVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  string value;
  string key;
  long *local_1b0 [2];
  long local_1a0 [2];
  key_type local_190 [3];
  ios_base local_120 [264];
  
  lVar1 = std::__cxx11::string::find((char)overStr,0x3d);
  if (lVar1 == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"CTest configuration overwrite specified in the wrong format.",
               0x3c);
    std::ios::widen((char)local_190 + (char)*(undefined8 *)(local_190[0]._M_dataplus._M_p + -0x18));
    std::ostream::put((char)local_190);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Valid format is: --overwrite key=value",0x26);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"The specified was: --overwrite ",0x1f);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(overStr->_M_dataplus)._M_p,overStr->_M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x9f7,(char *)local_1b0[0],false);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  else {
    std::__cxx11::string::substr((ulong)local_190,(ulong)overStr);
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)overStr);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->CTestConfigurationOverwrites,local_190);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
      operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmCTest::AddCTestConfigurationOverwrite(const std::string& overStr)
{
  size_t epos = overStr.find('=');
  if (epos == std::string::npos) {
    cmCTestLog(this, ERROR_MESSAGE,
               "CTest configuration overwrite specified in the wrong format."
                 << std::endl
                 << "Valid format is: --overwrite key=value" << std::endl
                 << "The specified was: --overwrite " << overStr << std::endl);
    return;
  }
  std::string key = overStr.substr(0, epos);
  std::string value = overStr.substr(epos + 1);
  this->CTestConfigurationOverwrites[key] = value;
}